

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

char * fmt::v5::internal::write_exponent(char *buffer,int exp)

{
  bool bVar1;
  long lVar2;
  char *d_1;
  char *d;
  char *pcStack_10;
  int exp_local;
  char *buffer_local;
  
  bVar1 = false;
  if ((-1000 < exp) && (bVar1 = false, exp < 1000)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(-1000 < exp && exp < 1000) && \"exponent out of range\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format-inl.h"
                  ,0x225,"char *fmt::internal::write_exponent(char *, int)");
  }
  if (exp < 0) {
    *buffer = '-';
    d._4_4_ = -exp;
  }
  else {
    *buffer = '+';
    d._4_4_ = exp;
  }
  pcStack_10 = buffer + 1;
  if (d._4_4_ < 100) {
    *pcStack_10 = basic_data<void>::DIGITS[d._4_4_ << 1];
    pcStack_10 = buffer + 3;
    buffer[2] = basic_data<void>::DIGITS[(long)(d._4_4_ << 1) + 1];
  }
  else {
    *pcStack_10 = (char)(d._4_4_ / 100) + '0';
    lVar2 = (long)(d._4_4_ % 100 << 1);
    buffer[2] = basic_data<void>::DIGITS[lVar2];
    pcStack_10 = buffer + 4;
    buffer[3] = basic_data<void>::DIGITS[lVar2 + 1];
  }
  return pcStack_10;
}

Assistant:

FMT_FUNC char *write_exponent(char *buffer, int exp) {
  FMT_ASSERT(-1000 < exp && exp < 1000, "exponent out of range");
  if (exp < 0) {
    *buffer++ = '-';
    exp = -exp;
  } else {
    *buffer++ = '+';
  }
  if (exp >= 100) {
    *buffer++ = static_cast<char>('0' + exp / 100);
    exp %= 100;
    const char *d = data::DIGITS + exp * 2;
    *buffer++ = d[0];
    *buffer++ = d[1];
  } else {
    const char *d = data::DIGITS + exp * 2;
    *buffer++ = d[0];
    *buffer++ = d[1];
  }
  return buffer;
}